

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

void rtmidi_in_set_callback(RtMidiInPtr device,RtMidiCCallback callback,void *userData)

{
  CallbackProxyUserData *this;
  RtMidiError *err;
  void *userData_local;
  RtMidiCCallback callback_local;
  RtMidiInPtr device_local;
  
  this = (CallbackProxyUserData *)operator_new(0x10);
  CallbackProxyUserData::CallbackProxyUserData(this,callback,userData);
  device->data = this;
  RtMidiIn::setCallback((RtMidiIn *)device->ptr,callback_proxy,device->data);
  return;
}

Assistant:

void rtmidi_in_set_callback (RtMidiInPtr device, RtMidiCCallback callback, void *userData)
{
    device->data = (void*) new CallbackProxyUserData (callback, userData);
    try {
        ((RtMidiIn*) device->ptr)->setCallback (callback_proxy, device->data);
    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        delete (CallbackProxyUserData*) device->data;
        device->data = 0;
    }
}